

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

Point2i __thiscall CT::Tracer(CT *this,Point2i *p,int *i_prev,bool *b_isolated)

{
  Point2i PVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 *in_R8;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = (long)(*(int *)b_isolated + 2) % 8;
  uVar4 = 0;
  uVar6 = 0;
  uVar3 = uVar2;
  do {
    switch(uVar3 & 0xffffffff) {
    case 0:
      uVar6 = i_prev[1];
      uVar4 = *i_prev + 1;
      break;
    case 1:
      iVar5 = i_prev[1];
      uVar4 = *i_prev + 1;
      goto LAB_0017ecd3;
    case 2:
      uVar4 = *i_prev;
      iVar5 = i_prev[1];
      goto LAB_0017ecd3;
    case 3:
      iVar5 = i_prev[1];
      uVar4 = *i_prev - 1;
LAB_0017ecd3:
      uVar6 = iVar5 + 1;
      break;
    case 4:
      uVar6 = i_prev[1];
      uVar4 = *i_prev - 1;
      break;
    case 5:
      iVar5 = i_prev[1];
      uVar4 = *i_prev - 1;
      goto LAB_0017ecea;
    case 6:
      uVar4 = *i_prev;
      iVar5 = i_prev[1];
      goto LAB_0017ecea;
    case 7:
      iVar5 = i_prev[1];
      uVar4 = *i_prev + 1;
LAB_0017ecea:
      uVar6 = iVar5 - 1;
    }
    if ((((-1 < (int)uVar6) && (-1 < (int)uVar4)) &&
        (PVar1 = p[0xc], (int)uVar6 < *(int *)((long)PVar1 + 8))) &&
       ((int)uVar4 < *(int *)((long)PVar1 + 0xc))) {
      lVar7 = (ulong)uVar6 * **(long **)((long)PVar1 + 0x48) + *(long *)((long)PVar1 + 0x10);
      if (*(char *)((ulong)uVar4 + lVar7) == (char)p[0xe].y) {
        *(int *)b_isolated = ((int)uVar3 + 4) % 8;
        *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
             uVar4;
        *(uint *)((long)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.
                         _vptr_Labeling + 4) = uVar6;
        return (Point2i)this;
      }
      *(undefined1 *)(lVar7 + (ulong)uVar4) = 0xff;
    }
    uVar3 = (long)((int)uVar3 + 1) % 8;
    if ((int)uVar3 == (int)uVar2) {
      *in_R8 = 1;
      (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
           *(_func_int ***)i_prev;
      return (Point2i)this;
    }
  } while( true );
}

Assistant:

cv::Point2i Tracer(const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img_.rows && crd_next.x < img_.cols) {
                if (img_.data[crd_next.y * img_.step[0] + crd_next.x] == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
					img_.data[crd_next.y * img_.step[0] + crd_next.x] = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }